

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::WriteORDOutput
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int summary_id,int epcalc,
          int eptype,double retperiod,OASIS_FLOAT loss)

{
  int strLen;
  char buffer [4096];
  char acStack_1018 [4096];
  
  strLen = snprintf(acStack_1018,0x1000,"%d,%d,%d,%f,%f\n",retperiod,(double)loss,summary_id,
                    (ulong)(uint)epcalc,(ulong)(uint)eptype);
  OutputRows(this,fileIDs,acStack_1018,strLen);
  return;
}

Assistant:

void aggreports::WriteORDOutput(const std::vector<int> &fileIDs,
				const int summary_id, const int epcalc,
				const int eptype, const double retperiod,
				const OASIS_FLOAT loss) {

  const int bufferSize = 4096;
  char buffer[bufferSize];
  int strLen;
  strLen = snprintf(buffer, bufferSize, "%d,%d,%d,%f,%f\n", summary_id, epcalc,
		    eptype, retperiod, loss);
  OutputRows(fileIDs, buffer, strLen);

}